

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_sectionstyle.cpp
# Opt level: O2

void __thiscall ON_SectionStyle::SetHatchColor(ON_SectionStyle *this,ON_Color *color,bool print)

{
  uint uVar1;
  uint uVar2;
  ON_Color *pOVar3;
  ON_SectionStylePrivate *this_00;
  undefined3 in_register_00000011;
  anon_union_4_2_6147a14e_for_ON_Color_15 local_2c;
  
  if (this->m_private == (ON_SectionStylePrivate *)0x0) {
    pOVar3 = &ON_Color::UnsetColor;
  }
  else {
    pOVar3 = &this->m_private->m_hatch_color + CONCAT31(in_register_00000011,print);
  }
  local_2c = pOVar3->field_0;
  uVar1 = ON_Color::operator_cast_to_unsigned_int((ON_Color *)&local_2c);
  uVar2 = ON_Color::operator_cast_to_unsigned_int(color);
  if (uVar1 != uVar2) {
    this_00 = this->m_private;
    if (this_00 == (ON_SectionStylePrivate *)0x0) {
      this_00 = (ON_SectionStylePrivate *)operator_new(0x50);
      this_00->m_background_fill_mode = None;
      this_00->m_fill_rule = ClosedCurves;
      *(undefined2 *)&this_00->field_0x2 = 0;
      this_00->m_hatch_index = 0;
      this_00->m_hatch_scale = 0.0;
      this_00->m_hatch_rotation = 0.0;
      this_00->m_background_fill_color = (anon_union_4_2_6147a14e_for_ON_Color_15)0x0;
      this_00->m_background_fill_print_color = (anon_union_4_2_6147a14e_for_ON_Color_15)0x0;
      this_00->m_boundary_color = (anon_union_4_2_6147a14e_for_ON_Color_15)0x0;
      this_00->m_boundary_print_color = (anon_union_4_2_6147a14e_for_ON_Color_15)0x0;
      this_00->m_hatch_color = (anon_union_4_2_6147a14e_for_ON_Color_15)0x0;
      this_00->m_hatch_print_color = (anon_union_4_2_6147a14e_for_ON_Color_15)0x0;
      *(undefined8 *)&this_00->m_boundary_visible = 0;
      this_00->m_boundary_width_scale = 0.0;
      (this_00->m_custom_linetype).super___shared_ptr<ON_Linetype,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)0x0;
      (this_00->m_custom_linetype).super___shared_ptr<ON_Linetype,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      ON_SectionStylePrivate::ON_SectionStylePrivate(this_00);
      this->m_private = this_00;
    }
    if (print) {
      (this_00->m_hatch_print_color).field_0 = color->field_0;
    }
    else {
      (this_00->m_hatch_color).field_0 = color->field_0;
    }
  }
  return;
}

Assistant:

void ON_SectionStyle::SetHatchColor(const ON_Color& color, bool print)
{
  if (HatchColor(print) == color)
    return;
  if (nullptr == m_private)
    m_private = new ON_SectionStylePrivate();

  if (print)
    m_private->m_hatch_print_color = color;
  else
    m_private->m_hatch_color = color;
}